

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme-test.cc
# Opt level: O1

function<void_()> * scope_example2::f(void)

{
  function<void_()> *in_RDI;
  long in_FS_OFFSET;
  MyLogger capture_messages;
  Logger local_80;
  
  Logger::Logger(&local_80);
  *(undefined8 *)&(in_RDI->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(in_RDI->super__Function_base)._M_functor + 8) = 0;
  in_RDI->_M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]capture-thread/test/readme-test.cc:157:10)>
       ::_M_invoke;
  (in_RDI->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]capture-thread/test/readme-test.cc:157:10)>
       ::_M_manager;
  local_80.super_ThreadCapture<Logger>._vptr_ThreadCapture = (_func_int **)&PTR__Logger_00107c88;
  local_80.cross_and_capture_to_.super_ThreadCrosser._vptr_ThreadCrosser =
       (_func_int **)&PTR__AutoThreadCrosser_00107cd0;
  *(Logger **)(in_FS_OFFSET + -0x10) = local_80.cross_and_capture_to_.capture_to_.previous_;
  capture_thread::ThreadCrosser::SetCurrent(local_80.cross_and_capture_to_.cross_with_.parent_);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_80.lines_.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  return in_RDI;
}

Assistant:

std::function<void()> f() {
  MyLogger capture_messages;
  return [] { MyLogger::Log("f was called"); };
}